

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_int64 fts3DocidRange(sqlite3_value *pVal,i64 iDefault)

{
  int iVar1;
  int eType;
  i64 iDefault_local;
  sqlite3_value *pVal_local;
  
  pVal_local = (sqlite3_value *)iDefault;
  if ((pVal != (sqlite3_value *)0x0) && (iVar1 = sqlite3_value_numeric_type(pVal), iVar1 == 1)) {
    pVal_local = (sqlite3_value *)sqlite3_value_int64(pVal);
  }
  return (sqlite3_int64)pVal_local;
}

Assistant:

static sqlite3_int64 fts3DocidRange(sqlite3_value *pVal, i64 iDefault){
  if( pVal ){
    int eType = sqlite3_value_numeric_type(pVal);
    if( eType==SQLITE_INTEGER ){
      return sqlite3_value_int64(pVal);
    }
  }
  return iDefault;
}